

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

error assemble_gpr(context *ctx,token *token,opcode *op,int address)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  byte in_R8B;
  token local_60;
  uint local_34;
  byte local_2d;
  byte local_2c;
  opcode *poStack_28;
  int address_local;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  poStack_28 = (opcode *)CONCAT44(in_register_0000000c,address);
  local_2d = 0;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  local_2c = in_R8B;
  confirm_type((token *)ctx,(token_type)op);
  bVar1 = error::operator_cast_to_bool((error *)ctx);
  if (bVar1) {
    local_2d = 1;
  }
  local_34 = (uint)bVar1;
  if ((local_2d & 1) == 0) {
    error::~error((error *)ctx);
  }
  if (local_34 == 0) {
    opcode::add_bits(poStack_28,(ulong)(byte)op_local->reuse << (local_2c & 0x3f));
    context::tokenize(&local_60,(context *)token_local);
    memcpy(op_local,&local_60,0x24);
    try_reuse(ctx,token_local,op_local,(int)poStack_28);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

static error assemble_gpr(context& ctx, token& token, opcode& op, int address)
{
    CHECK(confirm_type(token, token_type::regster));

    op.add_bits(static_cast<uint64_t>(token.data.regster) << address);

    token = ctx.tokenize();
    return try_reuse(ctx, token, op, address);
}